

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O2

void TestIterator(void)

{
  size_type sVar1;
  unit_test_log_t *puVar2;
  long lVar3;
  long lVar4;
  OutputBuffer *pOVar5;
  lazy_ostream *plVar6;
  InputBuffer *this;
  unit_test_log_t *this_00;
  long lVar7;
  OutputBuffer ob;
  InputBuffer ib;
  shared_count sStack_3a0;
  lazy_ostream local_398;
  undefined8 *local_388;
  size_t *local_380;
  difference_type local_378;
  size_t toWrite;
  char *local_368;
  undefined8 local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  const_string local_328;
  const_string local_318;
  const_string local_308;
  const_string local_2f8;
  char *local_2e8;
  char *local_2e0;
  const_string local_2d8;
  const_string local_2c8;
  char *local_2b8;
  char *local_2b0;
  const_string local_2a8;
  const_string local_298;
  char *local_288;
  char *local_280;
  const_string local_278;
  const_string local_268;
  char *local_258;
  char *local_250;
  const_string local_248;
  const_string local_238;
  const_string local_228;
  const_string local_218;
  const_string local_208;
  char *local_1f8;
  char *local_1f0;
  const_string local_1e8;
  const_string local_1d8;
  char *local_1c8;
  char *local_1c0;
  const_string local_1b8;
  const_string local_1a8;
  char *local_198;
  char *local_190;
  const_string local_188;
  const_string local_178;
  const_string local_168;
  const_string local_158;
  char *local_148;
  char *local_140;
  const_string local_138;
  const_string local_128;
  char *local_118;
  char *local_110;
  const_string local_108;
  const_string local_f8;
  char *local_e8;
  char *local_e0;
  const_string local_d8;
  const_string local_c8;
  BufferIterator<avro::detail::InputIteratorHelper> local_b8;
  BufferIterator<avro::detail::InputIteratorHelper> local_98;
  BufferIterator<avro::detail::OutputIteratorHelper> local_78;
  BufferIterator<avro::detail::OutputIteratorHelper> local_58;
  
  ib.pimpl_.px = (element_type *)anon_var_dwarf_8f9cc;
  ib.pimpl_.pn.pi_ = (sp_counted_base *)0x1ba178;
  sStack_3a0.pi_ = (sp_counted_base *)0x253;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)&ib);
  boost::unit_test::anon_unknown_0::s_log_impl();
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_entry_data.m_level = log_messages;
  ob.pimpl_.px._0_1_ = 1;
  local_398.m_empty = false;
  local_398._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001eab08;
  local_388 = &boost::unit_test::lazy_ostream::inst;
  local_380 = (size_t *)0x1ba674;
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)&ob,&local_398);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&ob);
  pOVar5 = &ob;
  avro::OutputBuffer::OutputBuffer(pOVar5,0x800a);
  local_c8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_c8.m_end = "";
  local_d8.m_begin = "";
  local_d8.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar5,&local_c8,0x256,&local_d8);
  plVar6 = &local_398;
  local_398.m_empty = false;
  local_398._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ea848;
  local_388 = &boost::unit_test::lazy_ostream::inst;
  local_380 = (size_t *)0x1b9884;
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_e0 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    ((deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_> *)
                     (CONCAT71(ob.pimpl_.px._1_7_,ob.pimpl_.px._0_1_) + 0x50));
  ib.pimpl_.px = (element_type *)CONCAT44(ib.pimpl_.px._4_4_,(int)sVar1);
  toWrite = CONCAT44(toWrite._4_4_,3);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (plVar6,&local_e8,0x256,1,2,&ib,"ob.numChunks()",&toWrite,"3");
  local_f8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_f8.m_end = "";
  local_108.m_begin = "";
  local_108.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar6,&local_f8,599,&local_108);
  plVar6 = &local_398;
  local_398.m_empty = false;
  local_398._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ea848;
  local_388 = &boost::unit_test::lazy_ostream::inst;
  local_380 = (size_t *)0x1b9884;
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_110 = "";
  ib.pimpl_.px = *(element_type **)(CONCAT71(ob.pimpl_.px._1_7_,ob.pimpl_.px._0_1_) + 0xa8);
  toWrite = toWrite & 0xffffffff00000000;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (plVar6,&local_118,599,1,2,&ib,"ob.size()",&toWrite,"0U");
  local_128.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_128.m_end = "";
  local_138.m_begin = "";
  local_138.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar6,&local_128,600,&local_138);
  plVar6 = &local_398;
  local_398.m_empty = false;
  local_398._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ea848;
  local_388 = &boost::unit_test::lazy_ostream::inst;
  local_380 = (size_t *)0x1b9884;
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_140 = "";
  ib.pimpl_.px = *(element_type **)(CONCAT71(ob.pimpl_.px._1_7_,ob.pimpl_.px._0_1_) + 0xa0);
  toWrite = 0x9000;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (plVar6,&local_148,600,1,2,&ib,"ob.freeSpace()",&toWrite,
             "2 * kMaxBlockSize + kMinBlockSize");
  local_158.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_158.m_end = "";
  local_168.m_begin = "";
  local_168.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar6,&local_158,0x25a,&local_168);
  local_398.m_empty = false;
  local_398._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ea848;
  local_388 = &boost::unit_test::lazy_ostream::inst;
  local_380 = (size_t *)0x1b9884;
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_340 = "";
  lVar3 = CONCAT71(ob.pimpl_.px._1_7_,ob.pimpl_.px._0_1_);
  local_58.helper_.iter_._M_cur = *(_Elt_pointer *)(lVar3 + 0x60);
  local_58.helper_.iter_._M_first = *(_Elt_pointer *)(lVar3 + 0x68);
  local_58.helper_.iter_._M_last = *(_Elt_pointer *)(lVar3 + 0x70);
  local_58.helper_.iter_._M_node = *(_Map_pointer *)(lVar3 + 0x78);
  local_78.helper_.iter_._M_cur = *(_Elt_pointer *)(lVar3 + 0x80);
  local_78.helper_.iter_._M_first = *(_Elt_pointer *)(lVar3 + 0x88);
  local_78.helper_.iter_._M_last = *(_Elt_pointer *)(lVar3 + 0x90);
  local_78.helper_.iter_._M_node = *(_Map_pointer *)(lVar3 + 0x98);
  ib.pimpl_.px = (element_type *)
                 std::distance<avro::detail::BufferIterator<avro::detail::OutputIteratorHelper>>
                           (&local_58,&local_78);
  toWrite = CONCAT44(toWrite._4_4_,3);
  plVar6 = &local_398;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (plVar6,&local_348,0x25a,1,2,&ib,"std::distance(ob.begin(), ob.end())",&toWrite,"3");
  lVar4 = CONCAT71(ob.pimpl_.px._1_7_,ob.pimpl_.px._0_1_);
  lVar7 = *(long *)(lVar4 + 0x60);
  lVar3 = *(long *)(lVar4 + 0x70);
  lVar4 = *(long *)(lVar4 + 0x78);
  local_178.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_178.m_end = "";
  local_188.m_begin = "";
  local_188.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar6,&local_178,0x25d,&local_188);
  plVar6 = &local_398;
  local_398.m_empty = false;
  local_398._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ea848;
  local_388 = &boost::unit_test::lazy_ostream::inst;
  local_380 = (size_t *)0x1b9884;
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_190 = "";
  ib.pimpl_.px = (element_type *)(*(long *)(lVar7 + 0x30) - *(long *)(lVar7 + 0x28));
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (plVar6,&local_198,0x25d,1,2,&ib,"iter->size()",&avro::detail::kMaxBlockSize,
             "kMaxBlockSize");
  lVar7 = lVar7 + 0x38;
  if (lVar7 == lVar3) {
    lVar7 = *(long *)(lVar4 + 8);
    lVar4 = lVar4 + 8;
    lVar3 = lVar7 + 0x1f8;
  }
  local_1a8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_1a8.m_end = "";
  local_1b8.m_begin = "";
  local_1b8.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar6,&local_1a8,0x25f,&local_1b8);
  plVar6 = &local_398;
  local_398.m_empty = false;
  local_398._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ea848;
  local_388 = &boost::unit_test::lazy_ostream::inst;
  local_380 = (size_t *)0x1b9884;
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_1c0 = "";
  ib.pimpl_.px = (element_type *)(*(long *)(lVar7 + 0x30) - *(long *)(lVar7 + 0x28));
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (plVar6,&local_1c8,0x25f,1,2,&ib,"iter->size()",&avro::detail::kMaxBlockSize,
             "kMaxBlockSize");
  lVar7 = lVar7 + 0x38;
  if (lVar7 == lVar3) {
    lVar7 = *(long *)(lVar4 + 8);
    lVar4 = lVar4 + 8;
    lVar3 = lVar7 + 0x1f8;
  }
  local_1d8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_1d8.m_end = "";
  local_1e8.m_begin = "";
  local_1e8.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar6,&local_1d8,0x261,&local_1e8);
  plVar6 = &local_398;
  local_398.m_empty = false;
  local_398._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ea848;
  local_388 = &boost::unit_test::lazy_ostream::inst;
  local_380 = (size_t *)0x1b9884;
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_1f0 = "";
  ib.pimpl_.px = (element_type *)(*(long *)(lVar7 + 0x30) - *(long *)(lVar7 + 0x28));
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (plVar6,&local_1f8,0x261,1,2,&ib,"iter->size()",&avro::detail::kMinBlockSize,
             "kMinBlockSize");
  lVar7 = lVar7 + 0x38;
  if (lVar7 == lVar3) {
    lVar7 = *(long *)(lVar4 + 8);
  }
  local_208.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_208.m_end = "";
  local_218.m_begin = "";
  local_218.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar6,&local_208,0x263,&local_218);
  ib.pimpl_.px = (element_type *)
                 CONCAT71(ib.pimpl_.px._1_7_,
                          lVar7 == *(long *)(CONCAT71(ob.pimpl_.px._1_7_,ob.pimpl_.px._0_1_) + 0x80)
                         );
  ib.pimpl_.pn.pi_ = (sp_counted_base *)0x0;
  sStack_3a0.pi_ = (sp_counted_base *)0x0;
  toWrite = (size_t)anon_var_dwarf_90f20;
  local_368 = "";
  local_398.m_empty = false;
  local_398._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001eab88;
  local_388 = &boost::unit_test::lazy_ostream::inst;
  local_380 = &toWrite;
  local_228.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_228.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&ib,&local_398,&local_228,0x263,CHECK,CHECK_PRED,0);
  boost::detail::shared_count::~shared_count(&sStack_3a0);
  toWrite = 0x5000;
  pOVar5 = &ob;
  avro::OutputBuffer::wroteTo(pOVar5,0x5000);
  local_238.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_238.m_end = "";
  local_248.m_begin = "";
  local_248.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar5,&local_238,0x267,&local_248);
  plVar6 = &local_398;
  local_398.m_empty = false;
  local_398._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ea848;
  local_388 = &boost::unit_test::lazy_ostream::inst;
  local_380 = (size_t *)0x1b9884;
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_250 = "";
  ib.pimpl_.px = *(element_type **)(CONCAT71(ob.pimpl_.px._1_7_,ob.pimpl_.px._0_1_) + 0xa8);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (plVar6,&local_258,0x267,1,2,&ib,"ob.size()",&toWrite,"toWrite");
  local_268.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_268.m_end = "";
  local_278.m_begin = "";
  local_278.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar6,&local_268,0x268,&local_278);
  plVar6 = &local_398;
  local_398.m_empty = false;
  local_398._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ea848;
  local_388 = &boost::unit_test::lazy_ostream::inst;
  local_380 = (size_t *)0x1b9884;
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_280 = "";
  ib.pimpl_.px = *(element_type **)(CONCAT71(ob.pimpl_.px._1_7_,ob.pimpl_.px._0_1_) + 0xa0);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (plVar6,&local_288,0x268,1,2,&ib,"ob.freeSpace()",&avro::detail::kMaxBlockSize,
             "kMaxBlockSize");
  local_298.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_298.m_end = "";
  local_2a8.m_begin = "";
  local_2a8.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar6,&local_298,0x269,&local_2a8);
  plVar6 = &local_398;
  local_398.m_empty = false;
  local_398._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ea848;
  local_388 = &boost::unit_test::lazy_ostream::inst;
  local_380 = (size_t *)0x1b9884;
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_2b0 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    ((deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_> *)
                     (CONCAT71(ob.pimpl_.px._1_7_,ob.pimpl_.px._0_1_) + 0x50));
  ib.pimpl_.px = (element_type *)CONCAT44(ib.pimpl_.px._4_4_,(int)sVar1);
  local_378._0_4_ = 2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (plVar6,&local_2b8,0x269,1,2,&ib,"ob.numChunks()",&local_378,"2");
  local_2c8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_2c8.m_end = "";
  local_2d8.m_begin = "";
  local_2d8.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar6,&local_2c8,0x26a,&local_2d8);
  local_398.m_empty = false;
  local_398._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ea848;
  local_388 = &boost::unit_test::lazy_ostream::inst;
  local_380 = (size_t *)0x1b9884;
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_2e0 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    ((deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_> *)
                     CONCAT71(ob.pimpl_.px._1_7_,ob.pimpl_.px._0_1_));
  ib.pimpl_.px = (element_type *)CONCAT44(ib.pimpl_.px._4_4_,(int)sVar1);
  local_378 = CONCAT44(local_378._4_4_,2);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_398,&local_2e8,0x26a,1,2,&ib,"ob.numDataChunks()",&local_378,"2");
  this = &ib;
  avro::InputBuffer::InputBuffer(this,&ob);
  local_2f8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_2f8.m_end = "";
  local_308.m_begin = "";
  local_308.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,&local_2f8,0x26d,&local_308);
  local_398.m_empty = false;
  local_398._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ea848;
  local_388 = &boost::unit_test::lazy_ostream::inst;
  local_380 = (size_t *)0x1b9884;
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_350 = "";
  local_98.helper_.iter_._M_cur =
       ((ib.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_98.helper_.iter_._M_first =
       ((ib.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_98.helper_.iter_._M_last =
       ((ib.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_98.helper_.iter_._M_node =
       ((ib.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  local_b8.helper_.iter_._M_cur =
       ((ib.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_finish._M_cur;
  local_b8.helper_.iter_._M_first =
       ((ib.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_finish._M_first;
  local_b8.helper_.iter_._M_last =
       ((ib.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_finish._M_last;
  local_b8.helper_.iter_._M_node =
       ((ib.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_finish._M_node;
  local_378 = std::distance<avro::detail::BufferIterator<avro::detail::InputIteratorHelper>>
                        (&local_98,&local_b8);
  local_360 = CONCAT44(local_360._4_4_,2);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&local_398,&local_358,0x26d,1,2,&local_378,"std::distance(ib.begin(), ib.end())",
             &local_360,"2");
  lVar4 = CONCAT71(ob.pimpl_.px._1_7_,ob.pimpl_.px._0_1_);
  puVar2 = *(unit_test_log_t **)(lVar4 + 0x60);
  this_00 = *(unit_test_log_t **)(lVar4 + 0x70);
  lVar3 = *(long *)(lVar4 + 0x78);
  local_378 = 0;
  while (puVar2 != *(unit_test_log_t **)(lVar4 + 0x80)) {
    local_378 = (long)puVar2[6].super_test_observer._vptr_test_observer +
                (local_378 - (long)puVar2[5].super_test_observer._vptr_test_observer);
    puVar2 = puVar2 + 7;
    if (puVar2 == this_00) {
      puVar2 = *(unit_test_log_t **)(lVar3 + 8);
      lVar3 = lVar3 + 8;
      this_00 = puVar2 + 0x3f;
    }
  }
  local_318.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_318.m_end = "";
  local_328.m_begin = "";
  local_328.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(this_00,&local_318,0x275,&local_328);
  local_398.m_empty = false;
  local_398._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ea848;
  local_388 = &boost::unit_test::lazy_ostream::inst;
  local_380 = (size_t *)0x1b9884;
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_330 = "";
  local_360 = *(undefined8 *)(CONCAT71(ob.pimpl_.px._1_7_,ob.pimpl_.px._0_1_) + 0xa0);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_398,&local_338,0x275,1,2,&local_360,"ob.freeSpace()",&local_378,"acc");
  avro::OutputBuffer::wroteTo(&ob,local_378 + 1);
  boost::detail::shared_count::~shared_count(&ib.pimpl_.pn);
  boost::detail::shared_count::~shared_count(&ob.pimpl_.pn);
  return;
}

Assistant:

void TestIterator() 
{
    BOOST_TEST_MESSAGE( "TestIterator");
    {
        OutputBuffer ob(2 * kMaxBlockSize + 10);
        BOOST_CHECK_EQUAL(ob.numChunks(), 3);
        BOOST_CHECK_EQUAL(ob.size(), 0U);
        BOOST_CHECK_EQUAL(ob.freeSpace(), 2 * kMaxBlockSize + kMinBlockSize);

        BOOST_CHECK_EQUAL (std::distance(ob.begin(), ob.end()), 3);

        OutputBuffer::const_iterator iter = ob.begin();
        BOOST_CHECK_EQUAL( iter->size(), kMaxBlockSize);
        ++iter;
        BOOST_CHECK_EQUAL( iter->size(), kMaxBlockSize);
        ++iter;
        BOOST_CHECK_EQUAL( iter->size(), kMinBlockSize);
        ++iter;
        BOOST_CHECK( iter == ob.end());

        size_t toWrite = kMaxBlockSize + kMinBlockSize;
        ob.wroteTo(toWrite);
        BOOST_CHECK_EQUAL(ob.size(), toWrite);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kMaxBlockSize);
        BOOST_CHECK_EQUAL(ob.numChunks(), 2);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 2);

        InputBuffer ib = ob;
        BOOST_CHECK_EQUAL (std::distance(ib.begin(), ib.end()), 2);

        size_t acc = 0;
        for(OutputBuffer::const_iterator iter = ob.begin();
            iter != ob.end(); 
            ++iter) {
            acc += iter->size();
        }
        BOOST_CHECK_EQUAL(ob.freeSpace(), acc);

        try {
            ob.wroteTo(acc+1);
        }
        catch (std::exception &e) {
            std::cout << "Intentionally triggered exception: " << e.what() << std::endl; 
        }
    }
}